

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

string * __thiscall Production::toStr_abi_cxx11_(string *__return_storage_ptr__,Production *this)

{
  bool bVar1;
  reference pbVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> state;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_90 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_4e;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38 [8];
  string uniqueID;
  Production *this_local;
  string *returnStr;
  
  uniqueID.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_4d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_4e);
  std::allocator<char>::~allocator(&local_4e);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 "#PROD.FROM#\n",&this->fromP);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,"\n")
  ;
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#PROD.STATES#\n");
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->toP);
  state.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->toP);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&state.field_2 + 8)), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_d0,(string *)pbVar2);
    __range1._4_4_ = __range1._4_4_ + 1;
    std::operator+(&local_f0,"#PROD.STATE#\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->toP);
    if ((long)__range1._4_4_ != sVar3) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    }
    std::__cxx11::string::~string((string *)local_d0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_4d = 1;
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Production::toStr() {
    std::string uniqueID = "";
    std::string returnStr = "";

    // from
    returnStr += "#PROD.FROM#\n" + fromP + "\n";
    returnStr += "#PROD.STATES#\n";

    // to
    int i = 0;
    for (auto state: toP) {
        i++;
        returnStr += "#PROD.STATE#\n" + state;
        if (i != toP.size()) {
            returnStr += "\n";
        }
    }

    return returnStr;
}